

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply-info.cpp
# Opt level: O2

bool print_ply_header(char *filename)

{
  int iVar1;
  pointer pPVar2;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  PLYFileType PVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  PLYElement *pPVar10;
  pointer puVar11;
  uint32_t idx;
  PLYProperty *prop_1;
  pointer pPVar12;
  PLYProperty *prop;
  PLYReader reader;
  PLYReader local_c0;
  
  miniply::PLYReader::PLYReader(&local_c0,filename);
  bVar4 = miniply::PLYReader::valid(&local_c0);
  if (bVar4) {
    puts("ply");
    PVar6 = miniply::PLYReader::file_type(&local_c0);
    iVar1 = *(int *)(_ZL10kFileTypes_rel + (long)(int)PVar6 * 4);
    uVar7 = miniply::PLYReader::version_major(&local_c0);
    uVar8 = miniply::PLYReader::version_minor(&local_c0);
    printf("format %s %d.%d\n",_ZL10kFileTypes_rel + iVar1,(ulong)uVar7,(ulong)uVar8);
    uVar9 = miniply::PLYReader::num_elements(&local_c0);
    for (idx = 0; idx != uVar9; idx = idx + 1) {
      pPVar10 = miniply::PLYReader::get_element(&local_c0,idx);
      printf("element %s %u\n",(pPVar10->name)._M_dataplus._M_p,(ulong)pPVar10->count);
      pPVar2 = (pPVar10->properties).
               super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pPVar12 = (pPVar10->properties).
                     super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                     ._M_impl.super__Vector_impl_data._M_start; pPVar12 != pPVar2;
          pPVar12 = pPVar12 + 1) {
        if ((ulong)pPVar12->countType == 8) {
          printf("property %s %s\n",kPropertyTypes[pPVar12->type],(pPVar12->name)._M_dataplus._M_p);
        }
        else {
          printf("property list %s %s %s\n",kPropertyTypes[pPVar12->countType],
                 kPropertyTypes[pPVar12->type],(pPVar12->name)._M_dataplus._M_p);
        }
      }
    }
    puts("end_header");
    while( true ) {
      bVar5 = miniply::PLYReader::has_element(&local_c0);
      if (!bVar5) break;
      pPVar10 = miniply::PLYReader::element(&local_c0);
      if ((pPVar10->fixedSize == false) && (pPVar10->count != 0)) {
        bVar5 = miniply::PLYReader::load_element(&local_c0);
        if (!bVar5) {
          fprintf(_stderr,"Element %s failed to load\n",(pPVar10->name)._M_dataplus._M_p);
        }
        pPVar2 = (pPVar10->properties).
                 super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pPVar12 = (pPVar10->properties).
                       super__Vector_base<miniply::PLYProperty,_std::allocator<miniply::PLYProperty>_>
                       ._M_impl.super__Vector_impl_data._M_start; pPVar12 != pPVar2;
            pPVar12 = pPVar12 + 1) {
          if (pPVar12->countType != None) {
            puVar3 = (pPVar12->rowCount).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar11 = puVar3;
            do {
              if (puVar11 ==
                  (pPVar12->rowCount).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                printf("Element \'%s\', list property \'%s\': all lists have size %u\n",
                       (pPVar10->name)._M_dataplus._M_p,(pPVar12->name)._M_dataplus._M_p);
                goto LAB_00107239;
              }
              uVar7 = *puVar11;
              puVar11 = puVar11 + 1;
            } while (uVar7 == *puVar3);
            printf("Element \'%s\', list property \'%s\': not all lists have the same size\n",
                   (pPVar10->name)._M_dataplus._M_p,(pPVar12->name)._M_dataplus._M_p);
          }
LAB_00107239:
        }
      }
      miniply::PLYReader::next_element(&local_c0);
    }
  }
  else {
    fprintf(_stderr,"Failed to open %s\n",filename);
  }
  miniply::PLYReader::~PLYReader(&local_c0);
  return bVar4;
}

Assistant:

bool print_ply_header(const char* filename)
{
  miniply::PLYReader reader(filename);
  if (!reader.valid()) {
    fprintf(stderr, "Failed to open %s\n", filename);
    return false;
  }

  printf("ply\n");
  printf("format %s %d.%d\n", kFileTypes[int(reader.file_type())], reader.version_major(), reader.version_minor());
  for (uint32_t i = 0, endI = reader.num_elements(); i < endI; i++) {
    const miniply::PLYElement* elem = reader.get_element(i);
    printf("element %s %u\n", elem->name.c_str(), elem->count);
    for (const miniply::PLYProperty& prop : elem->properties) {
      if (prop.countType != miniply::PLYPropertyType::None) {
        printf("property list %s %s %s\n", kPropertyTypes[uint32_t(prop.countType)], kPropertyTypes[uint32_t(prop.type)], prop.name.c_str());
      }
      else {
        printf("property %s %s\n", kPropertyTypes[uint32_t(prop.type)], prop.name.c_str());
      }
    }
  }
  printf("end_header\n");

  while (reader.has_element()) {
    const miniply::PLYElement* elem = reader.element();
    if (elem->fixedSize || elem->count == 0) {
      reader.next_element();
      continue;
    }

    if (!reader.load_element()) {
      fprintf(stderr, "Element %s failed to load\n", elem->name.c_str());
    }
    for (const miniply::PLYProperty& prop : elem->properties) {
      if (prop.countType == miniply::PLYPropertyType::None) {
        continue;
      }
      bool mixedSize = false;
      const uint32_t firstRowCount = prop.rowCount.front();
      for (const uint32_t rowCount : prop.rowCount) {
        if (rowCount != firstRowCount) {
          mixedSize = true;
          break;
        }
      }
      if (mixedSize) {
        printf("Element '%s', list property '%s': not all lists have the same size\n",
               elem->name.c_str(), prop.name.c_str());
      }
      else {
        printf("Element '%s', list property '%s': all lists have size %u\n",
               elem->name.c_str(), prop.name.c_str(), firstRowCount);
      }
    }
    reader.next_element();
  }

  return true;
}